

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O1

Status __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_solveRealStable(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,bool acceptUnbounded,bool acceptInfeasible,
                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *primal,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *dual,
                  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                  *basisStatusRows,
                  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                  *basisStatusCols,bool forceNoSimplifier)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  bool bVar1;
  int value;
  int value_00;
  int iVar2;
  int value_01;
  int value_02;
  Verbosity VVar3;
  Settings *pSVar4;
  ostream *poVar5;
  bool bVar6;
  char cVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  Status SVar15;
  int iVar16;
  undefined8 uVar17;
  SPxOut *pSVar18;
  undefined7 in_register_00000011;
  Verbosity old_verbosity_1;
  undefined7 in_register_00000031;
  bool bVar19;
  Verbosity old_verbosity;
  bool fromscratch;
  ulong uVar20;
  bool bVar21;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_348;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_308;
  int local_300;
  undefined4 local_2fc;
  undefined4 local_2f8;
  uint local_2f4;
  SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2f0;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e0;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2d8;
  SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2d0;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2c8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2c0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2b8;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined5 uStack_290;
  undefined3 uStack_28b;
  undefined5 local_288;
  undefined3 uStack_283;
  int local_280;
  bool local_27c;
  undefined8 local_278;
  cpp_dec_float<50U,_int,_void> local_268;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined5 uStack_210;
  undefined3 uStack_20b;
  undefined5 local_208;
  undefined3 uStack_203;
  int local_200;
  bool local_1fc;
  undefined8 local_1f8;
  cpp_dec_float<50U,_int,_void> local_1e8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined5 uStack_190;
  undefined3 uStack_18b;
  undefined5 local_188;
  undefined3 uStack_183;
  int local_180;
  bool local_17c;
  undefined8 local_178;
  cpp_dec_float<50U,_int,_void> local_168;
  uint local_128 [2];
  uint auStack_120 [2];
  uint local_118 [2];
  uint auStack_110 [2];
  uint local_108 [6];
  undefined8 uStack_f0;
  cpp_dec_float<50U,_int,_void> local_e0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined5 uStack_90;
  undefined3 uStack_8b;
  undefined5 uStack_88;
  undefined8 uStack_83;
  undefined8 local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_2fc = (undefined4)CONCAT71(in_register_00000011,acceptInfeasible);
  local_2f8 = (undefined4)CONCAT71(in_register_00000031,acceptUnbounded);
  local_108._0_8_ = *(undefined8 *)((this->_slufactor).lastThreshold.m_backend.data._M_elems + 8);
  local_128 = *(uint (*) [2])(this->_slufactor).lastThreshold.m_backend.data._M_elems;
  auStack_120 = *(uint (*) [2])((this->_slufactor).lastThreshold.m_backend.data._M_elems + 2);
  local_118 = *(uint (*) [2])((this->_slufactor).lastThreshold.m_backend.data._M_elems + 4);
  auStack_110 = *(uint (*) [2])((this->_slufactor).lastThreshold.m_backend.data._M_elems + 6);
  local_300 = (this->_slufactor).lastThreshold.m_backend.exp;
  bVar1 = (this->_slufactor).lastThreshold.m_backend.neg;
  local_108[4] = (this->_slufactor).lastThreshold.m_backend.fpclass;
  local_108[5] = (this->_slufactor).lastThreshold.m_backend.prec_elem;
  uStack_f0 = 0;
  pSVar4 = this->_currentSettings;
  value = pSVar4->_intParamValues[0xe];
  value_00 = pSVar4->_intParamValues[0xd];
  iVar2 = pSVar4->_intParamValues[2];
  value_01 = pSVar4->_intParamValues[10];
  value_02 = pSVar4->_intParamValues[0xb];
  local_2c0 = primal;
  local_2b8 = dual;
  local_2b0 = basisStatusRows;
  if (forceNoSimplifier) {
    setIntParam(this,SIMPLIFIER,0,true);
  }
  local_2d8 = &this->_slufactor;
  this_00 = &this->_solver;
  local_308 = &(this->_solver).entertolscale;
  local_2e0 = &(this->_solver).leavetolscale;
  local_2e8 = &(this->_ratiotesterTextbook).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  local_2c8 = &(this->_ratiotesterFast).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  local_2f0 = &(this->_pricerDevex).
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  local_2d0 = (SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&this->_pricerSteep;
  bVar19 = true;
  bVar6 = false;
  bVar12 = false;
  bVar8 = false;
  bVar13 = false;
  bVar14 = false;
  uVar20 = 0;
  bVar21 = false;
  bVar10 = false;
  bVar11 = false;
  fromscratch = false;
LAB_00359a0d:
  do {
    while( true ) {
      SVar15 = _solveRealForRational(this,fromscratch,local_2c0,local_2b8,local_2b0,basisStatusCols)
      ;
      bVar9 = 1;
      if ((SVar15 != OPTIMAL) && ((SVar15 != INFEASIBLE || ((char)local_2fc == '\0')))) {
        bVar9 = SVar15 == UNBOUNDED & (byte)local_2f8;
      }
      if (((uint)(SVar15 + (INForUNBD|INFEASIBLE)) < 2) || (bVar9 != 0)) goto LAB_0035a91e;
      if (bVar19) {
        VVar3 = (this->spxout).m_verbosity;
        if (2 < (int)VVar3) {
          (this->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((this->spxout).m_streams[3],"Numerical troubles during floating-point solve.",
                     0x2f);
          poVar5 = (this->spxout).m_streams[(this->spxout).m_verbosity];
          cVar7 = (char)poVar5;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + cVar7);
          std::ostream::put(cVar7);
          std::ostream::flush();
          (this->spxout).m_verbosity = VVar3;
        }
        bVar19 = false;
      }
      if (((uVar20 & 1) != 0) ||
         ((this->_currentSettings->_intParamValues[10] == 0 &&
          (this->_currentSettings->_intParamValues[0xb] == 0)))) break;
      VVar3 = (this->spxout).m_verbosity;
      if (2 < (int)VVar3) {
        (this->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[3],"Turning off preprocessing.",0x1a);
        poVar5 = (this->spxout).m_streams[(this->spxout).m_verbosity];
        cVar7 = (char)poVar5;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
        (this->spxout).m_verbosity = VVar3;
      }
      setIntParam(this,SCALER,0,true);
      setIntParam(this,SIMPLIFIER,0,true);
      uVar20 = CONCAT71((int7)(uVar20 >> 8),1);
LAB_00359d01:
      bVar11 = true;
      fromscratch = true;
    }
    setIntParam(this,SCALER,value_02,true);
    setIntParam(this,SIMPLIFIER,value_01,true);
    if (bVar10) break;
    VVar3 = (this->spxout).m_verbosity;
    local_2f4 = (uint)uVar20;
    if (2 < (int)VVar3) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],"Increasing Markowitz threshold.",0x1f);
      poVar5 = (this->spxout).m_streams[(this->spxout).m_verbosity];
      cVar7 = (char)poVar5;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
      (this->spxout).m_verbosity = VVar3;
    }
    local_78 = 0xa00000000;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    uStack_90 = 0;
    uStack_8b = 0;
    uStack_88 = 0;
    uStack_83 = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_a8,0.9);
    SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setMarkowitz(local_2d8,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_a8);
    bVar10 = true;
    uVar20 = (ulong)local_2f4;
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::factorize(this_00);
  } while( true );
  if (bVar11) {
    setIntParam(this,RATIOTESTER,value,true);
    setIntParam(this,PRICER,value_00,true);
    if (!bVar12) {
      VVar3 = (this->spxout).m_verbosity;
      if (2 < (int)VVar3) {
        (this->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[3],"Switching scaling.",0x12);
        poVar5 = (this->spxout).m_streams[(this->spxout).m_verbosity];
        cVar7 = (char)poVar5;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
        (this->spxout).m_verbosity = VVar3;
      }
      if (value_02 == 0) {
        iVar16 = 2;
      }
      else {
        iVar16 = 0;
      }
      setIntParam(this,SCALER,iVar16,true);
      bVar12 = true;
      goto LAB_00359d01;
    }
    if (!bVar8 && !forceNoSimplifier) {
      VVar3 = (this->spxout).m_verbosity;
      if (2 < (int)VVar3) {
        (this->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[3],"Switching simplification.",0x19);
        poVar5 = (this->spxout).m_streams[(this->spxout).m_verbosity];
        cVar7 = (char)poVar5;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
        (this->spxout).m_verbosity = VVar3;
      }
      if (value_01 == 0) {
        iVar16 = 3;
      }
      else {
        iVar16 = 0;
      }
      setIntParam(this,SIMPLIFIER,iVar16,true);
      bVar8 = true;
      goto LAB_00359d01;
    }
    setIntParam(this,SIMPLIFIER,0,true);
    if (bVar21) {
      if ((SVar15 == INFEASIBLE) || (bVar6)) {
        if ((DAT_006b8d88 <= iVar2) && (iVar2 <= DAT_006b8df8)) {
          this->_currentSettings->_intParamValues[2] = iVar2;
        }
        if (bVar13) {
          if (bVar14) {
            VVar3 = (this->spxout).m_verbosity;
            if (2 < (int)VVar3) {
              (this->spxout).m_verbosity = INFO1;
              pSVar18 = soplex::operator<<(&this->spxout,"Giving up.");
              std::endl<char,std::char_traits<char>>(pSVar18->m_streams[pSVar18->m_verbosity]);
              (this->spxout).m_verbosity = VVar3;
            }
LAB_0035a91e:
            local_68.m_backend.data._M_elems[8] = local_108[0];
            local_68.m_backend.data._M_elems[9] = local_108[1];
            local_68.m_backend.data._M_elems[4] = local_118[0];
            local_68.m_backend.data._M_elems[5] = local_118[1];
            local_68.m_backend.data._M_elems[6] = auStack_110[0];
            local_68.m_backend.data._M_elems[7] = auStack_110[1];
            local_68.m_backend.data._M_elems[0] = local_128[0];
            local_68.m_backend.data._M_elems[1] = local_128[1];
            local_68.m_backend.data._M_elems[2] = auStack_120[0];
            local_68.m_backend.data._M_elems[3] = auStack_120[1];
            local_68.m_backend.exp = local_300;
            local_68.m_backend.fpclass = local_108[4];
            local_68.m_backend.prec_elem = local_108[5];
            local_68.m_backend.neg = bVar1;
            SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::setMarkowitz(local_2d8,&local_68);
            setIntParam(this,RATIOTESTER,value,true);
            setIntParam(this,PRICER,value_00,true);
            setIntParam(this,SIMPLIFIER,value_01,true);
            setIntParam(this,SCALER,value_02,true);
            if ((DAT_006b8d88 <= iVar2) && (iVar2 <= DAT_006b8df8)) {
              this->_currentSettings->_intParamValues[2] = iVar2;
            }
            return SVar15;
          }
          VVar3 = (this->spxout).m_verbosity;
          if (2 < (int)VVar3) {
            (this->spxout).m_verbosity = INFO1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->spxout).m_streams[3],"Switching pricer.",0x11);
            poVar5 = (this->spxout).m_streams[(this->spxout).m_verbosity];
            cVar7 = (char)poVar5;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + cVar7);
            std::ostream::put(cVar7);
            std::ostream::flush();
            (this->spxout).m_verbosity = VVar3;
          }
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::setType(this_00,(uint)((this->_solver).theType != LEAVE) * 2 + ENTER);
          if ((this->_solver).thepricer == local_2f0) {
            bVar11 = false;
            bVar14 = true;
            if (4 < DAT_006b8e24 && DAT_006b8db4 < 6) {
              bVar11 = false;
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::setPricer(this_00,local_2d0,false);
              this->_currentSettings->_intParamValues[0xd] = 5;
            }
          }
          else {
            bVar11 = false;
            bVar14 = true;
            if (2 < DAT_006b8e24 && DAT_006b8db4 < 4) {
              bVar11 = false;
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::setPricer(this_00,local_2f0,false);
              this->_currentSettings->_intParamValues[0xd] = 3;
            }
          }
        }
        else {
          VVar3 = (this->spxout).m_verbosity;
          if (2 < (int)VVar3) {
            (this->spxout).m_verbosity = INFO1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->spxout).m_streams[3],"Switching ratio test.",0x15);
            poVar5 = (this->spxout).m_streams[(this->spxout).m_verbosity];
            cVar7 = (char)poVar5;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + cVar7);
            std::ostream::put(cVar7);
            std::ostream::flush();
            (this->spxout).m_verbosity = VVar3;
          }
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::setType(this_00,(uint)((this->_solver).theType != LEAVE) * 2 + ENTER);
          if ((this->_solver).theratiotester == local_2e8) {
            bVar11 = false;
            bVar13 = true;
            if (1 < DAT_006b8e28 && DAT_006b8db8 < 3) {
              bVar11 = false;
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::setTester(this_00,local_2c8,false);
              this->_currentSettings->_intParamValues[0xe] = 2;
            }
          }
          else {
            bVar11 = false;
            bVar13 = true;
            if (-1 < DAT_006b8e28 && DAT_006b8db8 < 1) {
              bVar11 = false;
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::setTester(this_00,local_2e8,false);
              this->_currentSettings->_intParamValues[0xe] = 0;
            }
          }
        }
      }
      else {
        VVar3 = (this->spxout).m_verbosity;
        if (2 < (int)VVar3) {
          (this->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((this->spxout).m_streams[3],"Tightening tolerances.",0x16);
          poVar5 = (this->spxout).m_streams[(this->spxout).m_verbosity];
          cVar7 = (char)poVar5;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + cVar7);
          std::ostream::put(cVar7);
          std::ostream::flush();
          (this->spxout).m_verbosity = VVar3;
        }
        if ((DAT_006b8d88 < 2) && (0 < DAT_006b8df8)) {
          this->_currentSettings->_intParamValues[2] = 1;
        }
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_e0,this_00);
        if (local_e0.fpclass == cpp_dec_float_NaN) {
LAB_0035a668:
          local_278._0_4_ = cpp_dec_float_finite;
          local_278._4_4_ = 10;
          local_2a8 = 0;
          uStack_2a0 = 0;
          local_298 = 0;
          uStack_290 = 0;
          uStack_28b = 0;
          local_288 = 0;
          uStack_283 = 0;
          local_280 = 0;
          local_27c = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_2a8,0.001);
          *(undefined8 *)(local_308->m_backend).data._M_elems = local_2a8;
          *(undefined8 *)((local_308->m_backend).data._M_elems + 2) = uStack_2a0;
          *(undefined8 *)((local_308->m_backend).data._M_elems + 4) = local_298;
          *(ulong *)((local_308->m_backend).data._M_elems + 6) = CONCAT35(uStack_28b,uStack_290);
          *(ulong *)((local_308->m_backend).data._M_elems + 8) = CONCAT35(uStack_283,local_288);
          (this->_solver).entertolscale.m_backend.exp = local_280;
          (this->_solver).entertolscale.m_backend.neg = local_27c;
          uVar17 = local_278;
        }
        else {
          local_348.fpclass = cpp_dec_float_finite;
          local_348.prec_elem = 10;
          local_348.data._M_elems[0] = 0;
          local_348.data._M_elems[1] = 0;
          local_348.data._M_elems[2] = 0;
          local_348.data._M_elems[3] = 0;
          local_348.data._M_elems[4] = 0;
          local_348.data._M_elems[5] = 0;
          local_348.data._M_elems._24_5_ = 0;
          local_348.data._M_elems[7]._1_3_ = 0;
          local_348.data._M_elems._32_5_ = 0;
          local_348._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_348,1e-06);
          iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_e0,&local_348);
          if (-1 < iVar16) goto LAB_0035a668;
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_e0,this_00);
          local_268.fpclass = cpp_dec_float_finite;
          local_268.prec_elem = 10;
          local_268.data._M_elems[0] = 0;
          local_268.data._M_elems[1] = 0;
          local_268.data._M_elems[2] = 0;
          local_268.data._M_elems[3] = 0;
          local_268.data._M_elems[4] = 0;
          local_268.data._M_elems[5] = 0;
          local_268.data._M_elems._24_5_ = 0;
          local_268.data._M_elems[7]._1_3_ = 0;
          local_268.data._M_elems._32_5_ = 0;
          local_268.data._M_elems[9]._1_3_ = 0;
          local_268.exp = 0;
          local_268.neg = false;
          local_348.fpclass = cpp_dec_float_finite;
          local_348.prec_elem = 10;
          local_348.data._M_elems[0] = 0;
          local_348.data._M_elems[1] = 0;
          local_348.data._M_elems[2] = 0;
          local_348.data._M_elems[3] = 0;
          local_348.data._M_elems[4] = 0;
          local_348.data._M_elems[5] = 0;
          local_348.data._M_elems._24_5_ = 0;
          local_348.data._M_elems[7]._1_3_ = 0;
          local_348.data._M_elems._32_5_ = 0;
          local_348._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_348,1e-09);
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_268,&local_348,&local_e0);
          *(ulong *)((local_308->m_backend).data._M_elems + 8) =
               CONCAT35(local_268.data._M_elems[9]._1_3_,local_268.data._M_elems._32_5_);
          *(undefined8 *)((local_308->m_backend).data._M_elems + 4) = local_268.data._M_elems._16_8_
          ;
          *(ulong *)((local_308->m_backend).data._M_elems + 6) =
               CONCAT35(local_268.data._M_elems[7]._1_3_,local_268.data._M_elems._24_5_);
          *(undefined8 *)(local_308->m_backend).data._M_elems = local_268.data._M_elems._0_8_;
          *(undefined8 *)((local_308->m_backend).data._M_elems + 2) = local_268.data._M_elems._8_8_;
          (this->_solver).entertolscale.m_backend.exp = local_268.exp;
          (this->_solver).entertolscale.m_backend.neg = local_268.neg;
          uVar17 = local_268._48_8_;
        }
        (this->_solver).entertolscale.m_backend.fpclass = (fpclass_type)uVar17;
        (this->_solver).entertolscale.m_backend.prec_elem = SUB84(uVar17,4);
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_e0,this_00);
        if (local_e0.fpclass == cpp_dec_float_NaN) {
          bVar6 = false;
        }
        else {
          local_348.fpclass = cpp_dec_float_finite;
          local_348.prec_elem = 10;
          local_348.data._M_elems[0] = 0;
          local_348.data._M_elems[1] = 0;
          local_348.data._M_elems[2] = 0;
          local_348.data._M_elems[3] = 0;
          local_348.data._M_elems[4] = 0;
          local_348.data._M_elems[5] = 0;
          local_348.data._M_elems._24_5_ = 0;
          local_348.data._M_elems[7]._1_3_ = 0;
          local_348.data._M_elems._32_5_ = 0;
          local_348._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_348,1e-09);
          iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_e0,&local_348);
          bVar6 = iVar16 < 1;
        }
        bVar11 = false;
      }
    }
    else {
      VVar3 = (this->spxout).m_verbosity;
      if (2 < (int)VVar3) {
        (this->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[3],"Relaxing tolerances.",0x14);
        poVar5 = (this->spxout).m_streams[(this->spxout).m_verbosity];
        cVar7 = (char)poVar5;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
        (this->spxout).m_verbosity = VVar3;
      }
      if ((DAT_006b8d88 < 1) && (-1 < DAT_006b8df8)) {
        this->_currentSettings->_intParamValues[2] = 0;
      }
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_e0,this_00);
      if (local_e0.fpclass == cpp_dec_float_NaN) {
LAB_0035a27f:
        local_178._0_4_ = cpp_dec_float_finite;
        local_178._4_4_ = 10;
        local_1a8 = 0;
        uStack_1a0 = 0;
        local_198 = 0;
        uStack_190 = 0;
        uStack_18b = 0;
        local_188 = 0;
        uStack_183 = 0;
        local_180 = 0;
        local_17c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_1a8,1000.0);
        *(undefined8 *)(local_308->m_backend).data._M_elems = local_1a8;
        *(undefined8 *)((local_308->m_backend).data._M_elems + 2) = uStack_1a0;
        *(undefined8 *)((local_308->m_backend).data._M_elems + 4) = local_198;
        *(ulong *)((local_308->m_backend).data._M_elems + 6) = CONCAT35(uStack_18b,uStack_190);
        *(ulong *)((local_308->m_backend).data._M_elems + 8) = CONCAT35(uStack_183,local_188);
        (this->_solver).entertolscale.m_backend.exp = local_180;
        (this->_solver).entertolscale.m_backend.neg = local_17c;
        uVar17 = local_178;
      }
      else {
        local_348.fpclass = cpp_dec_float_finite;
        local_348.prec_elem = 10;
        local_348.data._M_elems[0] = 0;
        local_348.data._M_elems[1] = 0;
        local_348.data._M_elems[2] = 0;
        local_348.data._M_elems[3] = 0;
        local_348.data._M_elems[4] = 0;
        local_348.data._M_elems[5] = 0;
        local_348.data._M_elems._24_5_ = 0;
        local_348.data._M_elems[7]._1_3_ = 0;
        local_348.data._M_elems._32_5_ = 0;
        local_348._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_348,1e-06);
        iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_e0,&local_348);
        if (iVar16 < 1) goto LAB_0035a27f;
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_e0,this_00);
        local_168.fpclass = cpp_dec_float_finite;
        local_168.prec_elem = 10;
        local_168.data._M_elems[0] = 0;
        local_168.data._M_elems[1] = 0;
        local_168.data._M_elems[2] = 0;
        local_168.data._M_elems[3] = 0;
        local_168.data._M_elems[4] = 0;
        local_168.data._M_elems[5] = 0;
        local_168.data._M_elems._24_5_ = 0;
        local_168.data._M_elems[7]._1_3_ = 0;
        local_168.data._M_elems._32_5_ = 0;
        local_168.data._M_elems[9]._1_3_ = 0;
        local_168.exp = 0;
        local_168.neg = false;
        local_348.fpclass = cpp_dec_float_finite;
        local_348.prec_elem = 10;
        local_348.data._M_elems[0] = 0;
        local_348.data._M_elems[1] = 0;
        local_348.data._M_elems[2] = 0;
        local_348.data._M_elems[3] = 0;
        local_348.data._M_elems[4] = 0;
        local_348.data._M_elems[5] = 0;
        local_348.data._M_elems._24_5_ = 0;
        local_348.data._M_elems[7]._1_3_ = 0;
        local_348.data._M_elems._32_5_ = 0;
        local_348._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_348,0.001);
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_168,&local_348,&local_e0);
        *(ulong *)((local_308->m_backend).data._M_elems + 8) =
             CONCAT35(local_168.data._M_elems[9]._1_3_,local_168.data._M_elems._32_5_);
        *(undefined8 *)((local_308->m_backend).data._M_elems + 4) = local_168.data._M_elems._16_8_;
        *(ulong *)((local_308->m_backend).data._M_elems + 6) =
             CONCAT35(local_168.data._M_elems[7]._1_3_,local_168.data._M_elems._24_5_);
        *(undefined8 *)(local_308->m_backend).data._M_elems = local_168.data._M_elems._0_8_;
        *(undefined8 *)((local_308->m_backend).data._M_elems + 2) = local_168.data._M_elems._8_8_;
        (this->_solver).entertolscale.m_backend.exp = local_168.exp;
        (this->_solver).entertolscale.m_backend.neg = local_168.neg;
        uVar17 = local_168._48_8_;
      }
      (this->_solver).entertolscale.m_backend.fpclass = (fpclass_type)uVar17;
      (this->_solver).entertolscale.m_backend.prec_elem = SUB84(uVar17,4);
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::leavetol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_e0,this_00);
      if (local_e0.fpclass == cpp_dec_float_NaN) {
LAB_0035a42d:
        local_1f8._0_4_ = cpp_dec_float_finite;
        local_1f8._4_4_ = 10;
        local_228 = 0;
        uStack_220 = 0;
        local_218 = 0;
        uStack_210 = 0;
        uStack_20b = 0;
        local_208 = 0;
        uStack_203 = 0;
        local_200 = 0;
        local_1fc = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_228,1000.0);
        *(undefined8 *)(local_2e0->m_backend).data._M_elems = local_228;
        *(undefined8 *)((local_2e0->m_backend).data._M_elems + 2) = uStack_220;
        *(undefined8 *)((local_2e0->m_backend).data._M_elems + 4) = local_218;
        *(ulong *)((local_2e0->m_backend).data._M_elems + 6) = CONCAT35(uStack_20b,uStack_210);
        *(ulong *)((local_2e0->m_backend).data._M_elems + 8) = CONCAT35(uStack_203,local_208);
        (this->_solver).leavetolscale.m_backend.exp = local_200;
        (this->_solver).leavetolscale.m_backend.neg = local_1fc;
        uVar17 = local_1f8;
      }
      else {
        local_348.fpclass = cpp_dec_float_finite;
        local_348.prec_elem = 10;
        local_348.data._M_elems[0] = 0;
        local_348.data._M_elems[1] = 0;
        local_348.data._M_elems[2] = 0;
        local_348.data._M_elems[3] = 0;
        local_348.data._M_elems[4] = 0;
        local_348.data._M_elems[5] = 0;
        local_348.data._M_elems._24_5_ = 0;
        local_348.data._M_elems[7]._1_3_ = 0;
        local_348.data._M_elems._32_5_ = 0;
        local_348._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_348,1e-06);
        iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_e0,&local_348);
        if (iVar16 < 1) goto LAB_0035a42d;
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::leavetol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_e0,this_00);
        local_1e8.fpclass = cpp_dec_float_finite;
        local_1e8.prec_elem = 10;
        local_1e8.data._M_elems[0] = 0;
        local_1e8.data._M_elems[1] = 0;
        local_1e8.data._M_elems[2] = 0;
        local_1e8.data._M_elems[3] = 0;
        local_1e8.data._M_elems[4] = 0;
        local_1e8.data._M_elems[5] = 0;
        local_1e8.data._M_elems._24_5_ = 0;
        local_1e8.data._M_elems[7]._1_3_ = 0;
        local_1e8.data._M_elems._32_5_ = 0;
        local_1e8.data._M_elems[9]._1_3_ = 0;
        local_1e8.exp = 0;
        local_1e8.neg = false;
        local_348.fpclass = cpp_dec_float_finite;
        local_348.prec_elem = 10;
        local_348.data._M_elems[0] = 0;
        local_348.data._M_elems[1] = 0;
        local_348.data._M_elems[2] = 0;
        local_348.data._M_elems[3] = 0;
        local_348.data._M_elems[4] = 0;
        local_348.data._M_elems[5] = 0;
        local_348.data._M_elems._24_5_ = 0;
        local_348.data._M_elems[7]._1_3_ = 0;
        local_348.data._M_elems._32_5_ = 0;
        local_348._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_348,0.001);
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_1e8,&local_348,&local_e0);
        *(ulong *)((local_2e0->m_backend).data._M_elems + 8) =
             CONCAT35(local_1e8.data._M_elems[9]._1_3_,local_1e8.data._M_elems._32_5_);
        *(undefined8 *)((local_2e0->m_backend).data._M_elems + 4) = local_1e8.data._M_elems._16_8_;
        *(ulong *)((local_2e0->m_backend).data._M_elems + 6) =
             CONCAT35(local_1e8.data._M_elems[7]._1_3_,local_1e8.data._M_elems._24_5_);
        *(undefined8 *)(local_2e0->m_backend).data._M_elems = local_1e8.data._M_elems._0_8_;
        *(undefined8 *)((local_2e0->m_backend).data._M_elems + 2) = local_1e8.data._M_elems._8_8_;
        (this->_solver).leavetolscale.m_backend.exp = local_1e8.exp;
        (this->_solver).leavetolscale.m_backend.neg = local_1e8.neg;
        uVar17 = local_1e8._48_8_;
      }
      (this->_solver).leavetolscale.m_backend.fpclass = (fpclass_type)uVar17;
      (this->_solver).leavetolscale.m_backend.prec_elem = SUB84(uVar17,4);
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_e0,this_00);
      if (local_e0.fpclass == cpp_dec_float_NaN) {
        bVar21 = false;
      }
      else {
        local_348.fpclass = cpp_dec_float_finite;
        local_348.prec_elem = 10;
        local_348.data._M_elems[0] = 0;
        local_348.data._M_elems[1] = 0;
        local_348.data._M_elems[2] = 0;
        local_348.data._M_elems[3] = 0;
        local_348.data._M_elems[4] = 0;
        local_348.data._M_elems[5] = 0;
        local_348.data._M_elems._24_5_ = 0;
        local_348.data._M_elems[7]._1_3_ = 0;
        local_348.data._M_elems._32_5_ = 0;
        local_348._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_348,0.001);
        iVar16 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_e0,&local_348);
        bVar21 = -1 < iVar16;
      }
      bVar11 = false;
    }
  }
  else {
    VVar3 = (this->spxout).m_verbosity;
    bVar11 = true;
    fromscratch = true;
    if (2 < (int)VVar3) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],"Solving from scratch.",0x15);
      poVar5 = (this->spxout).m_streams[(this->spxout).m_verbosity];
      cVar7 = (char)poVar5;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
      (this->spxout).m_verbosity = VVar3;
      fromscratch = true;
    }
  }
  goto LAB_00359a0d;
}

Assistant:

typename SPxSolverBase<R>::Status SoPlexBase<R>::_solveRealStable(bool acceptUnbounded,
      bool acceptInfeasible, VectorBase<R>& primal, VectorBase<R>& dual,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusRows,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusCols,
      const bool forceNoSimplifier)
{
   typename SPxSolverBase<R>::Status result = SPxSolverBase<R>::UNKNOWN;

   bool fromScratch = false;
   bool solved = false;
   bool solvedFromScratch = false;
   bool initialSolve = true;
   bool increasedMarkowitz = false;
   bool relaxedTolerances = false;
   bool tightenedTolerances = false;
   bool switchedScaler = false;
   bool switchedSimplifier = false;
   bool switchedRatiotester = false;
   bool switchedPricer = false;
   bool turnedoffPre = false;

   R markowitz = _slufactor.markowitz();
   int ratiotester = intParam(SoPlexBase<R>::RATIOTESTER);
   int pricer = intParam(SoPlexBase<R>::PRICER);
   int simplifier = intParam(SoPlexBase<R>::SIMPLIFIER);
   int scaler = intParam(SoPlexBase<R>::SCALER);
   int type = intParam(SoPlexBase<R>::ALGORITHM);

   if(forceNoSimplifier)
      setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

   while(true)
   {
      assert(!increasedMarkowitz || GE(_slufactor.markowitz(), R(0.9), this->tolerances()->epsilon()));

      result = _solveRealForRational(fromScratch, primal, dual, basisStatusRows, basisStatusCols);

      solved = (result == SPxSolverBase<R>::OPTIMAL)
               || (result == SPxSolverBase<R>::INFEASIBLE && acceptInfeasible)
               || (result == SPxSolverBase<R>::UNBOUNDED && acceptUnbounded);

      if(solved || result == SPxSolverBase<R>::ABORT_TIME || result == SPxSolverBase<R>::ABORT_ITER)
         break;

      if(initialSolve)
      {
         SPX_MSG_INFO1(spxout, spxout << "Numerical troubles during floating-point solve." << std::endl);
         initialSolve = false;
      }

      if(!turnedoffPre
            && (intParam(SoPlexBase<R>::SIMPLIFIER) != SoPlexBase<R>::SIMPLIFIER_OFF
                || intParam(SoPlexBase<R>::SCALER) != SoPlexBase<R>::SCALER_OFF))
      {
         SPX_MSG_INFO1(spxout, spxout << "Turning off preprocessing." << std::endl);

         turnedoffPre = true;

         setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_OFF);
         setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::SCALER, scaler);
      setIntParam(SoPlexBase<R>::SIMPLIFIER, simplifier);

      if(!increasedMarkowitz)
      {
         SPX_MSG_INFO1(spxout, spxout << "Increasing Markowitz threshold." << std::endl);

         _slufactor.setMarkowitz(0.9);
         increasedMarkowitz = true;

         try
         {
            _solver.factorize();
            continue;
         }
         catch(...)
         {
            SPxOut::debug(this, "Factorization failed.\n");
         }
      }

      if(!solvedFromScratch)
      {
         SPX_MSG_INFO1(spxout, spxout << "Solving from scratch." << std::endl);

         fromScratch = true;
         solvedFromScratch = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::RATIOTESTER, ratiotester);
      setIntParam(SoPlexBase<R>::PRICER, pricer);

      if(!switchedScaler)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching scaling." << std::endl);

         if(scaler == int(SoPlexBase<R>::SCALER_OFF))
            setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_BIEQUI);
         else
            setIntParam(SoPlexBase<R>::SCALER, SoPlexBase<R>::SCALER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         switchedScaler = true;
         continue;
      }

      if(!switchedSimplifier && !forceNoSimplifier)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching simplification." << std::endl);

         if(simplifier == int(SoPlexBase<R>::SIMPLIFIER_OFF))
            setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_INTERNAL);
         else
            setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

         fromScratch = true;
         solvedFromScratch = true;
         switchedSimplifier = true;
         continue;
      }

      setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

      if(!relaxedTolerances)
      {
         SPX_MSG_INFO1(spxout, spxout << "Relaxing tolerances." << std::endl);

         setIntParam(SoPlexBase<R>::ALGORITHM, SoPlexBase<R>::ALGORITHM_PRIMAL);

         // scale tols by up 1e3 but so that they do not exceed 1e-3
         if(_solver.entertol() > 1e-6)
            _solver.scaleEntertol(1e-3 / _solver.entertol());
         else
            _solver.scaleEntertol(1e3);

         if(_solver.leavetol() > 1e-6)
            _solver.scaleLeavetol(1e-3 / _solver.leavetol());
         else
            _solver.scaleLeavetol(1e3);

         relaxedTolerances = _solver.entertol() >= 1e-3;
         solvedFromScratch = false;
         continue;
      }

      if(!tightenedTolerances && result != SPxSolverBase<R>::INFEASIBLE)
      {
         SPX_MSG_INFO1(spxout, spxout << "Tightening tolerances." << std::endl);

         setIntParam(SoPlexBase<R>::ALGORITHM, SoPlexBase<R>::ALGORITHM_DUAL);

         // scale tols by up 1e-3 but so that they are not smaller than 1e-9
         if(_solver.entertol() < 1e-6)
            _solver.scaleEntertol(1e-9 / _solver.entertol());
         else
            _solver.scaleEntertol(1e-3);

         tightenedTolerances = _solver.entertol() <= 1e-9;
         solvedFromScratch = false;
         continue;
      }

      setIntParam(SoPlexBase<R>::ALGORITHM, type);

      if(!switchedRatiotester)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching ratio test." << std::endl);

         _solver.setType(_solver.type() == SPxSolverBase<R>::LEAVE ? SPxSolverBase<R>::ENTER :
                         SPxSolverBase<R>::LEAVE);

         if(_solver.ratiotester() != (SPxRatioTester<R>*)&_ratiotesterTextbook)
            setIntParam(SoPlexBase<R>::RATIOTESTER, RATIOTESTER_TEXTBOOK);
         else
            setIntParam(SoPlexBase<R>::RATIOTESTER, RATIOTESTER_FAST);

         switchedRatiotester = true;
         solvedFromScratch = false;
         continue;
      }

      if(!switchedPricer)
      {
         SPX_MSG_INFO1(spxout, spxout << "Switching pricer." << std::endl);

         _solver.setType(_solver.type() == SPxSolverBase<R>::LEAVE ? SPxSolverBase<R>::ENTER :
                         SPxSolverBase<R>::LEAVE);

         if(_solver.pricer() != (SPxPricer<R>*)&_pricerDevex)
            setIntParam(SoPlexBase<R>::PRICER, PRICER_DEVEX);
         else
            setIntParam(SoPlexBase<R>::PRICER, PRICER_STEEP);

         switchedPricer = true;
         solvedFromScratch = false;
         continue;
      }

      SPX_MSG_INFO1(spxout, spxout << "Giving up." << std::endl);

      break;
   }

   _slufactor.setMarkowitz(markowitz);

   setIntParam(SoPlexBase<R>::RATIOTESTER, ratiotester);
   setIntParam(SoPlexBase<R>::PRICER, pricer);
   setIntParam(SoPlexBase<R>::SIMPLIFIER, simplifier);
   setIntParam(SoPlexBase<R>::SCALER, scaler);
   setIntParam(SoPlexBase<R>::ALGORITHM, type);

   return result;
}